

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O0

string * toLower(string *__return_storage_ptr__,string *in)

{
  int iVar1;
  char *pcVar2;
  allocator<char> local_2f;
  undefined1 local_2e;
  char local_2d;
  int local_2c;
  char thischar;
  char *pcStack_28;
  int i;
  char *buffer;
  string *psStack_18;
  int len;
  string *in_local;
  string *result;
  
  psStack_18 = in;
  in_local = __return_storage_ptr__;
  buffer._4_4_ = std::__cxx11::string::size();
  pcStack_28 = (char *)operator_new__((long)(buffer._4_4_ + 1));
  for (local_2c = 0; pcVar2 = pcStack_28, local_2c < buffer._4_4_; local_2c = local_2c + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in);
    local_2d = *pcVar2;
    iVar1 = tolower((int)local_2d);
    local_2d = (char)iVar1;
    pcStack_28[local_2c] = local_2d;
  }
  pcStack_28[buffer._4_4_] = '\0';
  local_2e = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2,&local_2f);
  std::allocator<char>::~allocator(&local_2f);
  if (pcStack_28 != (char *)0x0) {
    operator_delete__(pcStack_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toLower(std::string in ) {
     int len = static_cast<int>( in.size() );
     char *buffer = new char[len + 1];
     for( int i = 0; i < len; i++ ) {
        char thischar = in[i];
        thischar = tolower(thischar);
        buffer[i] = thischar;
    }
    buffer[len] = 0;
    std::string result = std::string(buffer);
    delete[] buffer;
    return result;
}